

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# super_simple_test.cpp
# Opt level: O1

int main(void)

{
  spin_mutex_t sVar1;
  int iVar2;
  long *plVar3;
  char *pcVar4;
  bool bVar5;
  int i;
  int local_1c;
  
  local_1c = 0;
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::spawn<void(int&),int&>(f,&local_1c);
  do {
    sVar1.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar1.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"post-spawn",10);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  depspawn::wait_for_all();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Final i=",8);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_1c);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  iVar2 = local_1c;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TEST ",5);
  bVar5 = iVar2 != 10;
  pcVar4 = "SUCCESSFUL";
  if (bVar5) {
    pcVar4 = "UNSUCCESSFUL";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar4,(ulong)bVar5 * 2 + 10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  return (int)bVar5;
}

Assistant:

int main()
{ int i = 0;

  t0 = std::chrono::high_resolution_clock::now();
  
  spawn(f, i);
  
  LOG("post-spawn");
  
  wait_for_all();

  std::cout << "Final i=" << i << std::endl;

  const bool test_ok = (i == 10);
  
  std::cout << "TEST " << (test_ok ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  return !test_ok;
}